

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb_a<ncnn::BinaryOp_x86_fma_functor::binary_op_ratan2>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  uint uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  int in_ECX;
  undefined8 *in_RDX;
  uint *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  float fVar135;
  float fVar136;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  __m128 _outp_2;
  __m128 _b_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m128 _b1;
  __m128 _b0;
  __m256 _p_256;
  __m128 _p_1;
  int i_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_ratan2 op;
  __m256 special_result_1;
  __m256 negative_mask_full_x_1;
  __m256 normal_result_1;
  __m256 pi_additions_1;
  __m256 negative_mask_y_1;
  __m256 negative_mask_x_1;
  __m256 normal_mode_1;
  __m256 not_equal_zero_y_1;
  __m256 not_equal_zero_x_1;
  __m256 magic_half_pi_2;
  __m256 magic_pi_1;
  __m256 magic_negative_zero_2;
  __m256 magic_zero_1;
  __m256 output_approx_1;
  __m256 fourth_power_of_input_approx_1;
  __m256 square_of_input_approx_1;
  __m256 input_approx_1;
  __m256 is_small_input_1;
  __m256 absolute_1;
  __m256 negative_mask_1;
  __m256 magic_a8_1;
  __m256 magic_a7_1;
  __m256 magic_a6_1;
  __m256 magic_a5_1;
  __m256 magic_a4_1;
  __m256 magic_a3_1;
  __m256 magic_a2_1;
  __m256 magic_a1_1;
  __m256 magic_a0_1;
  __m256 magic_half_pi_3;
  __m256 magic_negative_one_1;
  __m256 magic_one_1;
  __m256 magic_negative_zero_3;
  __m256 special_result;
  __m256 negative_mask_full_x;
  __m256 normal_result;
  __m256 pi_additions;
  __m256 negative_mask_y;
  __m256 negative_mask_x;
  __m256 normal_mode;
  __m256 not_equal_zero_y;
  __m256 not_equal_zero_x;
  __m256 magic_half_pi;
  __m256 magic_pi;
  __m256 magic_negative_zero;
  __m256 magic_zero;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero_1;
  __m128 special_result_2;
  __m128 negative_mask_full_x_2;
  __m128 normal_result_2;
  __m128 pi_additions_2;
  __m128 negative_mask_y_2;
  __m128 negative_mask_x_2;
  __m128 normal_mode_2;
  __m128 not_equal_zero_y_2;
  __m128 not_equal_zero_x_2;
  __m128 magic_half_pi_4;
  __m128 magic_pi_2;
  __m128 magic_negative_zero_4;
  __m128 magic_zero_2;
  __m128 output_approx_2;
  __m128 fourth_power_of_input_approx_2;
  __m128 square_of_input_approx_2;
  __m128 input_approx_2;
  __m128 is_small_input_2;
  __m128 absolute_2;
  __m128 negative_mask_2;
  __m128 magic_a8_2;
  __m128 magic_a7_2;
  __m128 magic_a6_2;
  __m128 magic_a5_2;
  __m128 magic_a4_2;
  __m128 magic_a3_2;
  __m128 magic_a2_2;
  __m128 magic_a1_2;
  __m128 magic_a0_2;
  __m128 magic_half_pi_5;
  __m128 magic_negative_one_2;
  __m128 magic_one_2;
  __m128 magic_negative_zero_5;
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  int local_3b44;
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 uStack_3b30;
  undefined8 uStack_3b28;
  int local_3ad0;
  undefined8 *local_3ac0;
  uint *local_3ab8;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  float local_3740;
  float fStack_373c;
  float fStack_3738;
  float fStack_3734;
  float fStack_3730;
  float fStack_372c;
  float fStack_3728;
  float fStack_3724;
  float local_3720;
  float fStack_371c;
  float fStack_3718;
  float fStack_3714;
  float fStack_3710;
  float fStack_370c;
  float fStack_3708;
  float fStack_3704;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  float local_2ea0;
  float fStack_2e9c;
  float fStack_2e98;
  float fStack_2e94;
  float fStack_2e90;
  float fStack_2e8c;
  float fStack_2e88;
  float fStack_2e84;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 uStack_2c10;
  undefined8 uStack_2c08;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  float local_2ac0;
  float fStack_2abc;
  float fStack_2ab8;
  float fStack_2ab4;
  float local_2a40;
  float fStack_2a3c;
  float fStack_2a38;
  float fStack_2a34;
  float fStack_2a30;
  float fStack_2a2c;
  float fStack_2a28;
  float fStack_2a24;
  uint local_2380;
  uint uStack_237c;
  uint uStack_2378;
  uint uStack_2374;
  uint uStack_2370;
  uint uStack_236c;
  uint uStack_2368;
  uint uStack_2364;
  float local_20e0;
  float fStack_20dc;
  float fStack_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  float fStack_20c8;
  float fStack_20c4;
  float local_20c0;
  float fStack_20bc;
  float fStack_20b8;
  float fStack_20b4;
  float fStack_20b0;
  float fStack_20ac;
  float fStack_20a8;
  float fStack_20a4;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  float local_1840;
  float fStack_183c;
  float fStack_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float fStack_1828;
  float fStack_1824;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  float local_1460;
  float fStack_145c;
  float fStack_1458;
  float fStack_1454;
  float local_13e0;
  float fStack_13dc;
  float fStack_13d8;
  float fStack_13d4;
  float fStack_13d0;
  float fStack_13cc;
  float fStack_13c8;
  float fStack_13c4;
  uint local_d20;
  uint uStack_d1c;
  uint uStack_d18;
  uint uStack_d14;
  uint uStack_d10;
  uint uStack_d0c;
  uint uStack_d08;
  uint uStack_d04;
  float local_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  float local_b60;
  float fStack_b5c;
  float fStack_b58;
  float fStack_b54;
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  float local_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  float local_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  
  local_3ac0 = in_RDX;
  local_3ab8 = in_RSI;
  if (in_R8D == 8) {
    local_3ad0 = 0;
    auVar15 = *in_RDI;
    auVar5 = *in_RDI;
    auVar4 = *in_RDI;
    auVar14 = *in_RDI;
    for (; local_3ad0 < in_ECX; local_3ad0 = local_3ad0 + 1) {
      uVar1 = *local_3ab8;
      auVar17 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(uVar1),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(uVar1),0x30);
      auVar18 = vinsertps_avx(ZEXT416(uVar1),ZEXT416(uVar1),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(uVar1),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(uVar1),0x30);
      uStack_3970 = auVar18._0_8_;
      uStack_3968 = auVar18._8_8_;
      auVar84._16_8_ = uStack_3970;
      auVar84._0_16_ = auVar17;
      auVar84._24_8_ = uStack_3968;
      auVar83._16_8_ = uStack_3970;
      auVar83._0_16_ = auVar17;
      auVar83._24_8_ = uStack_3968;
      auVar82._16_8_ = uStack_3970;
      auVar82._0_16_ = auVar17;
      auVar82._24_8_ = uStack_3968;
      auVar9._16_8_ = uStack_3970;
      auVar9._0_16_ = auVar17;
      auVar9._24_8_ = uStack_3968;
      auVar17 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0),0x20);
      auVar17 = vinsertps_avx(auVar17,ZEXT416(0),0x30);
      auVar18 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0),0x30);
      uStack_2070 = auVar18._0_8_;
      uStack_2068 = auVar18._8_8_;
      auVar18 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x80000000),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x80000000),0x30);
      auVar19 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x80000000),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x80000000),0x30);
      uStack_2030 = auVar19._0_8_;
      uStack_2028 = auVar19._8_8_;
      auVar19 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x40490fdb),0x20);
      auVar19 = vinsertps_avx(auVar19,ZEXT416(0x40490fdb),0x30);
      auVar20 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x40490fdb),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x40490fdb),0x30);
      uStack_1ff0 = auVar20._0_8_;
      uStack_1fe8 = auVar20._8_8_;
      auVar20 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x20);
      auVar20 = vinsertps_avx(auVar20,ZEXT416(0x3fc90fdb),0x30);
      auVar21 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3fc90fdb),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3fc90fdb),0x30);
      uStack_1fb0 = auVar21._0_8_;
      uStack_1fa8 = auVar21._8_8_;
      auVar8._16_8_ = uStack_2070;
      auVar8._0_16_ = auVar17;
      auVar8._24_8_ = uStack_2068;
      auVar8 = vcmpps_avx(auVar14,auVar8,4);
      auVar2._16_8_ = uStack_2070;
      auVar2._0_16_ = auVar17;
      auVar2._24_8_ = uStack_2068;
      auVar9 = vcmpps_avx(auVar9,auVar2,4);
      auVar8 = vandps_avx(auVar8,auVar9);
      auVar12._16_8_ = uStack_2030;
      auVar12._0_16_ = auVar18;
      auVar12._24_8_ = uStack_2028;
      auVar2 = vandps_avx(auVar12,auVar4);
      auVar7._16_8_ = uStack_2030;
      auVar7._0_16_ = auVar18;
      auVar7._24_8_ = uStack_2028;
      auVar3 = vandps_avx(auVar7,auVar82);
      auVar11._16_8_ = uStack_2070;
      auVar11._0_16_ = auVar17;
      auVar11._24_8_ = uStack_2068;
      auVar10 = vcmpps_avx(auVar5,auVar11,1);
      auVar11 = vcmpps_avx(auVar83,auVar11,1);
      auVar6._16_8_ = uStack_2030;
      auVar6._0_16_ = auVar18;
      auVar6._24_8_ = uStack_2028;
      auVar11 = vandps_avx(auVar11,auVar6);
      auVar65._16_8_ = uStack_1ff0;
      auVar65._0_16_ = auVar19;
      auVar65._24_8_ = uStack_1fe8;
      auVar11 = vorps_avx(auVar11,auVar65);
      auVar11 = vandps_avx(auVar10,auVar11);
      auVar16 = vdivps_avx(auVar84,auVar15);
      auVar18 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x80000000),0x20);
      auVar18 = vinsertps_avx(auVar18,ZEXT416(0x80000000),0x30);
      auVar21 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x80000000),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x80000000),0x30);
      uStack_17b0 = auVar21._0_8_;
      uStack_17a8 = auVar21._8_8_;
      auVar21 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x20);
      auVar21 = vinsertps_avx(auVar21,ZEXT416(0x3f800000),0x30);
      auVar22 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0x3f800000),0x30);
      uStack_1770 = auVar22._0_8_;
      uStack_1768 = auVar22._8_8_;
      auVar22 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0xbf800000),0x20);
      auVar22 = vinsertps_avx(auVar22,ZEXT416(0xbf800000),0x30);
      auVar23 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbf800000),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0xbf800000),0x30);
      uStack_1730 = auVar23._0_8_;
      uStack_1728 = auVar23._8_8_;
      auVar23 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3fc90fdb),0x20);
      auVar23 = vinsertps_avx(auVar23,ZEXT416(0x3fc90fdb),0x30);
      auVar24 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3fc90fdb),0x20);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3fc90fdb),0x30);
      uStack_16f0 = auVar24._0_8_;
      uStack_16e8 = auVar24._8_8_;
      auVar24 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3f800000),0x20);
      auVar24 = vinsertps_avx(auVar24,ZEXT416(0x3f800000),0x30);
      auVar25 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3f800000),0x20);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0x3f800000),0x30);
      uStack_16b0 = auVar25._0_8_;
      uStack_16a8 = auVar25._8_8_;
      auVar25 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0xbeaaaa53),0x20);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0xbeaaaa53),0x30);
      auVar26 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0xbeaaaa53),0x20);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0xbeaaaa53),0x30);
      uStack_1670 = auVar26._0_8_;
      uStack_1668 = auVar26._8_8_;
      auVar26 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0x3e4cb974),0x20);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0x3e4cb974),0x30);
      auVar27 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0x3e4cb974),0x20);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0x3e4cb974),0x30);
      uStack_1630 = auVar27._0_8_;
      uStack_1628 = auVar27._8_8_;
      auVar27 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbe117200),0x20);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0xbe117200),0x30);
      auVar28 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0xbe117200),0x20);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0xbe117200),0x30);
      uStack_15f0 = auVar28._0_8_;
      uStack_15e8 = auVar28._8_8_;
      auVar28 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3dd9ed24),0x20);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3dd9ed24),0x30);
      auVar29 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3dd9ed24),0x20);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3dd9ed24),0x30);
      uStack_15b0 = auVar29._0_8_;
      uStack_15a8 = auVar29._8_8_;
      auVar29 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0xbd99b01e),0x20);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0xbd99b01e),0x30);
      auVar30 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0xbd99b01e),0x20);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0xbd99b01e),0x30);
      uStack_1570 = auVar30._0_8_;
      uStack_1568 = auVar30._8_8_;
      auVar30 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0x3d2edd4e),0x20);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0x3d2edd4e),0x30);
      auVar31 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0x3d2edd4e),0x20);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0x3d2edd4e),0x30);
      uStack_1530 = auVar31._0_8_;
      uStack_1528 = auVar31._8_8_;
      auVar31 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbc83a25c),0x20);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbc83a25c),0x30);
      auVar32 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0xbc83a25c),0x20);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0xbc83a25c),0x30);
      uStack_14f0 = auVar32._0_8_;
      uStack_14e8 = auVar32._8_8_;
      auVar32 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3b3ac537),0x20);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3b3ac537),0x30);
      auVar33 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3b3ac537),0x20);
      auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3b3ac537),0x30);
      uStack_14b0 = auVar33._0_8_;
      uStack_14a8 = auVar33._8_8_;
      auVar69._16_8_ = uStack_17b0;
      auVar69._0_16_ = auVar18;
      auVar69._24_8_ = uStack_17a8;
      auVar10 = vandps_avx(auVar69,auVar16);
      auVar72._16_8_ = uStack_17b0;
      auVar72._0_16_ = auVar18;
      auVar72._24_8_ = uStack_17a8;
      auVar12 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar6 = vandnps_avx(auVar72,auVar16);
      auVar66._16_8_ = uStack_1770;
      auVar66._0_16_ = auVar21;
      auVar66._24_8_ = uStack_1768;
      auVar13 = vcmpps_avx(auVar66,auVar6,1);
      auVar68._16_8_ = uStack_1730;
      auVar68._0_16_ = auVar22;
      auVar68._24_8_ = uStack_1728;
      auVar16 = vandps_avx(auVar13,auVar68);
      auVar7 = vandnps_avx(auVar13,auVar6);
      auVar7 = vorps_avx(auVar16,auVar7);
      auVar16 = vandps_avx(auVar13,auVar6);
      auVar71._16_8_ = uStack_1770;
      auVar71._0_16_ = auVar21;
      auVar71._24_8_ = uStack_1768;
      auVar6 = vandnps_avx(auVar13,auVar71);
      auVar16 = vorps_avx(auVar16,auVar6);
      auVar16 = vdivps_avx(auVar7,auVar16);
      local_13e0 = auVar16._0_4_;
      fStack_13dc = auVar16._4_4_;
      fStack_13d8 = auVar16._8_4_;
      fStack_13d4 = auVar16._12_4_;
      fStack_13d0 = auVar16._16_4_;
      fStack_13cc = auVar16._20_4_;
      fStack_13c8 = auVar16._24_4_;
      fStack_13c4 = auVar16._28_4_;
      fVar135 = local_13e0 * local_13e0;
      fVar139 = fStack_13dc * fStack_13dc;
      fVar141 = fStack_13d8 * fStack_13d8;
      fVar143 = fStack_13d4 * fStack_13d4;
      fVar145 = fStack_13d0 * fStack_13d0;
      fVar147 = fStack_13cc * fStack_13cc;
      fVar149 = fStack_13c8 * fStack_13c8;
      fVar136 = fVar135 * fVar135;
      fVar140 = fVar139 * fVar139;
      fVar142 = fVar141 * fVar141;
      fVar144 = fVar143 * fVar143;
      fVar146 = fVar145 * fVar145;
      fVar148 = fVar147 * fVar147;
      fVar150 = fVar149 * fVar149;
      auVar102._4_4_ = fVar140;
      auVar102._0_4_ = fVar136;
      auVar102._8_4_ = fVar142;
      auVar102._12_4_ = fVar144;
      auVar102._16_4_ = fVar146;
      auVar102._20_4_ = fVar148;
      auVar102._24_4_ = fVar150;
      auVar102._28_4_ = fStack_13c4;
      auVar111._16_8_ = uStack_14f0;
      auVar111._0_16_ = auVar31;
      auVar111._24_8_ = uStack_14e8;
      auVar113._16_8_ = uStack_1570;
      auVar113._0_16_ = auVar29;
      auVar113._24_8_ = uStack_1568;
      auVar18 = vfmadd213ps_fma(auVar111,auVar102,auVar113);
      auVar103._4_4_ = fVar140;
      auVar103._0_4_ = fVar136;
      auVar103._8_4_ = fVar142;
      auVar103._12_4_ = fVar144;
      auVar103._16_4_ = fVar146;
      auVar103._20_4_ = fVar148;
      auVar103._24_4_ = fVar150;
      auVar103._28_4_ = fStack_13c4;
      auVar115._16_8_ = uStack_15f0;
      auVar115._0_16_ = auVar27;
      auVar115._24_8_ = uStack_15e8;
      auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar103,auVar115);
      auVar104._4_4_ = fVar140;
      auVar104._0_4_ = fVar136;
      auVar104._8_4_ = fVar142;
      auVar104._12_4_ = fVar144;
      auVar104._16_4_ = fVar146;
      auVar104._20_4_ = fVar148;
      auVar104._24_4_ = fVar150;
      auVar104._28_4_ = fStack_13c4;
      auVar117._16_8_ = uStack_1670;
      auVar117._0_16_ = auVar25;
      auVar117._24_8_ = uStack_1668;
      auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar104,auVar117);
      auVar105._4_4_ = fVar140;
      auVar105._0_4_ = fVar136;
      auVar105._8_4_ = fVar142;
      auVar105._12_4_ = fVar144;
      auVar105._16_4_ = fVar146;
      auVar105._20_4_ = fVar148;
      auVar105._24_4_ = fVar150;
      auVar105._28_4_ = fStack_13c4;
      auVar110._16_8_ = uStack_14b0;
      auVar110._0_16_ = auVar32;
      auVar110._24_8_ = uStack_14a8;
      auVar112._16_8_ = uStack_1530;
      auVar112._0_16_ = auVar30;
      auVar112._24_8_ = uStack_1528;
      auVar21 = vfmadd213ps_fma(auVar110,auVar105,auVar112);
      auVar106._4_4_ = fVar140;
      auVar106._0_4_ = fVar136;
      auVar106._8_4_ = fVar142;
      auVar106._12_4_ = fVar144;
      auVar106._16_4_ = fVar146;
      auVar106._20_4_ = fVar148;
      auVar106._24_4_ = fVar150;
      auVar106._28_4_ = fStack_13c4;
      auVar114._16_8_ = uStack_15b0;
      auVar114._0_16_ = auVar28;
      auVar114._24_8_ = uStack_15a8;
      auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar106,auVar114);
      auVar107._4_4_ = fVar140;
      auVar107._0_4_ = fVar136;
      auVar107._8_4_ = fVar142;
      auVar107._12_4_ = fVar144;
      auVar107._16_4_ = fVar146;
      auVar107._20_4_ = fVar148;
      auVar107._24_4_ = fVar150;
      auVar107._28_4_ = fStack_13c4;
      auVar116._16_8_ = uStack_1630;
      auVar116._0_16_ = auVar26;
      auVar116._24_8_ = uStack_1628;
      auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar107,auVar116);
      auVar108._4_4_ = fVar140;
      auVar108._0_4_ = fVar136;
      auVar108._8_4_ = fVar142;
      auVar108._12_4_ = fVar144;
      auVar108._16_4_ = fVar146;
      auVar108._20_4_ = fVar148;
      auVar108._24_4_ = fVar150;
      auVar108._28_4_ = fStack_13c4;
      auVar118._16_8_ = uStack_16b0;
      auVar118._0_16_ = auVar24;
      auVar118._24_8_ = uStack_16a8;
      auVar21 = vfmadd213ps_fma(ZEXT1632(auVar21),auVar108,auVar118);
      auVar109._4_4_ = fVar139;
      auVar109._0_4_ = fVar135;
      auVar109._8_4_ = fVar141;
      auVar109._12_4_ = fVar143;
      auVar109._16_4_ = fVar145;
      auVar109._20_4_ = fVar147;
      auVar109._24_4_ = fVar149;
      auVar109._28_4_ = fStack_13c4;
      auVar18 = vfmadd213ps_fma(ZEXT1632(auVar18),auVar109,ZEXT1632(auVar21));
      local_1460 = auVar18._0_4_;
      fStack_145c = auVar18._4_4_;
      fStack_1458 = auVar18._8_4_;
      fStack_1454 = auVar18._12_4_;
      auVar67._16_8_ = uStack_16f0;
      auVar67._0_16_ = auVar23;
      auVar67._24_8_ = uStack_16e8;
      auVar16 = vandps_avx(auVar13,auVar67);
      local_1840 = auVar16._0_4_;
      fStack_183c = auVar16._4_4_;
      fStack_1838 = auVar16._8_4_;
      fStack_1834 = auVar16._12_4_;
      fStack_1830 = auVar16._16_4_;
      fStack_182c = auVar16._20_4_;
      fStack_1828 = auVar16._24_4_;
      fStack_1824 = auVar16._28_4_;
      auVar70._4_4_ = fStack_145c * fStack_13dc + fStack_183c;
      auVar70._0_4_ = local_1460 * local_13e0 + local_1840;
      auVar70._8_4_ = fStack_1458 * fStack_13d8 + fStack_1838;
      auVar70._12_4_ = fStack_1454 * fStack_13d4 + fStack_1834;
      auVar70._16_4_ = fStack_13d0 * 0.0 + fStack_1830;
      auVar70._20_4_ = fStack_13cc * 0.0 + fStack_182c;
      auVar70._24_4_ = fStack_13c8 * 0.0 + fStack_1828;
      auVar70._28_4_ = fStack_13c4 + fStack_1824;
      auVar10 = vorps_avx(auVar70,auVar10);
      local_20c0 = auVar10._0_4_;
      fStack_20bc = auVar10._4_4_;
      fStack_20b8 = auVar10._8_4_;
      fStack_20b4 = auVar10._12_4_;
      fStack_20b0 = auVar10._16_4_;
      fStack_20ac = auVar10._20_4_;
      fStack_20a8 = auVar10._24_4_;
      fStack_20a4 = auVar10._28_4_;
      local_20e0 = auVar11._0_4_;
      fStack_20dc = auVar11._4_4_;
      fStack_20d8 = auVar11._8_4_;
      fStack_20d4 = auVar11._12_4_;
      fStack_20d0 = auVar11._16_4_;
      fStack_20cc = auVar11._20_4_;
      fStack_20c8 = auVar11._24_4_;
      fStack_20c4 = auVar11._28_4_;
      auVar64._16_8_ = uStack_1ff0;
      auVar64._0_16_ = auVar19;
      auVar64._24_8_ = uStack_1fe8;
      auVar2 = vorps_avx(auVar2,auVar64);
      auVar10._16_8_ = uStack_2070;
      auVar10._0_16_ = auVar17;
      auVar10._24_8_ = uStack_2068;
      auVar11 = vcmpps_avx(auVar2,auVar10,1);
      auVar13._16_8_ = uStack_1fb0;
      auVar13._0_16_ = auVar20;
      auVar13._24_8_ = uStack_1fa8;
      auVar2 = vorps_avx(auVar3,auVar13);
      auVar2 = vandps_avx(auVar9,auVar2);
      auVar3._16_8_ = uStack_1ff0;
      auVar3._0_16_ = auVar19;
      auVar3._24_8_ = uStack_1fe8;
      auVar3 = vandps_avx(auVar11,auVar3);
      auVar73._16_8_ = uStack_2070;
      auVar73._0_16_ = auVar17;
      auVar73._24_8_ = uStack_2068;
      auVar11 = vandnps_avx(auVar11,auVar73);
      auVar3 = vorps_avx(auVar3,auVar11);
      auVar3 = vandnps_avx(auVar9,auVar3);
      auVar3 = vorps_avx(auVar2,auVar3);
      auVar16._4_4_ = fStack_20bc + fStack_20dc;
      auVar16._0_4_ = local_20c0 + local_20e0;
      auVar16._12_4_ = fStack_20b4 + fStack_20d4;
      auVar16._8_4_ = fStack_20b8 + fStack_20d8;
      auVar16._20_4_ = fStack_20ac + fStack_20cc;
      auVar16._16_4_ = fStack_20b0 + fStack_20d0;
      auVar16._28_4_ = fStack_20a4 + fStack_20c4;
      auVar16._24_4_ = fStack_20a8 + fStack_20c8;
      auVar2 = vandps_avx(auVar8,auVar16);
      local_d20 = auVar8._0_4_;
      uStack_d1c = auVar8._4_4_;
      uStack_d18 = auVar8._8_4_;
      uStack_d14 = auVar8._12_4_;
      uStack_d10 = auVar8._16_4_;
      uStack_d0c = auVar8._20_4_;
      uStack_d08 = auVar8._24_4_;
      uStack_d04 = auVar8._28_4_;
      auVar137._0_4_ = local_d20 ^ auVar12._0_4_;
      auVar137._4_4_ = uStack_d1c ^ auVar12._4_4_;
      auVar137._8_4_ = uStack_d18 ^ auVar12._8_4_;
      auVar137._12_4_ = uStack_d14 ^ auVar12._12_4_;
      auVar137._16_4_ = uStack_d10 ^ auVar12._16_4_;
      auVar137._20_4_ = uStack_d0c ^ auVar12._20_4_;
      auVar137._24_4_ = uStack_d08 ^ auVar12._24_4_;
      auVar137._28_4_ = uStack_d04 ^ auVar12._28_4_;
      auVar8 = vandps_avx(auVar137,auVar3);
      auVar8 = vorps_avx(auVar2,auVar8);
      local_3b40 = auVar8._0_8_;
      uStack_3b38 = auVar8._8_8_;
      uStack_3b30 = auVar8._16_8_;
      uStack_3b28 = auVar8._24_8_;
      *local_3ac0 = local_3b40;
      local_3ac0[1] = uStack_3b38;
      local_3ac0[2] = uStack_3b30;
      local_3ac0[3] = uStack_3b28;
      local_3ab8 = local_3ab8 + 1;
      local_3ac0 = local_3ac0 + 4;
    }
  }
  if (in_R8D == 4) {
    local_3b44 = 0;
    uVar42 = *(undefined8 *)*in_RDI;
    uVar43 = *(undefined8 *)(*in_RDI + 8);
    auVar24 = *(undefined1 (*) [16])*in_RDI;
    auVar23 = *(undefined1 (*) [16])*in_RDI;
    auVar22 = *(undefined1 (*) [16])*in_RDI;
    auVar21 = *(undefined1 (*) [16])*in_RDI;
    auVar20 = *(undefined1 (*) [16])*in_RDI;
    auVar19 = *(undefined1 (*) [16])*in_RDI;
    auVar18 = *(undefined1 (*) [16])*in_RDI;
    auVar17 = *(undefined1 (*) [16])*in_RDI;
    for (; local_3b44 + 1 < in_ECX; local_3b44 = local_3b44 + 2) {
      uVar1 = *local_3ab8;
      uVar46 = CONCAT44(uVar1,uVar1);
      uVar47 = CONCAT44(uVar1,uVar1);
      uVar1 = local_3ab8[1];
      uVar44 = CONCAT44(uVar1,uVar1);
      uVar45 = CONCAT44(uVar1,uVar1);
      auVar77._8_8_ = uVar47;
      auVar77._0_8_ = uVar46;
      auVar77._16_8_ = uVar44;
      auVar77._24_8_ = uVar45;
      auVar76._8_8_ = uVar47;
      auVar76._0_8_ = uVar46;
      auVar76._16_8_ = uVar44;
      auVar76._24_8_ = uVar45;
      auVar75._8_8_ = uVar47;
      auVar75._0_8_ = uVar46;
      auVar75._16_8_ = uVar44;
      auVar75._24_8_ = uVar45;
      auVar74._8_8_ = uVar47;
      auVar74._0_8_ = uVar46;
      auVar74._16_8_ = uVar44;
      auVar74._24_8_ = uVar45;
      auVar81._16_8_ = uVar42;
      auVar81._0_16_ = auVar20;
      auVar81._24_8_ = uVar43;
      auVar80._16_8_ = uVar42;
      auVar80._0_16_ = auVar19;
      auVar80._24_8_ = uVar43;
      auVar79._16_8_ = uVar42;
      auVar79._0_16_ = auVar18;
      auVar79._24_8_ = uVar43;
      auVar78._16_8_ = uVar42;
      auVar78._0_16_ = auVar17;
      auVar78._24_8_ = uVar43;
      auVar25 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0),0x20);
      auVar25 = vinsertps_avx(auVar25,ZEXT416(0),0x30);
      auVar26 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0),0x20);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0),0x30);
      uStack_36d0 = auVar26._0_8_;
      uStack_36c8 = auVar26._8_8_;
      auVar26 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0x80000000),0x20);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0x80000000),0x30);
      auVar27 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0x80000000),0x20);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0x80000000),0x30);
      uStack_3690 = auVar27._0_8_;
      uStack_3688 = auVar27._8_8_;
      auVar27 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0x40490fdb),0x20);
      auVar27 = vinsertps_avx(auVar27,ZEXT416(0x40490fdb),0x30);
      auVar28 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x40490fdb),0x20);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x40490fdb),0x30);
      uStack_3650 = auVar28._0_8_;
      uStack_3648 = auVar28._8_8_;
      auVar28 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3fc90fdb),0x20);
      auVar28 = vinsertps_avx(auVar28,ZEXT416(0x3fc90fdb),0x30);
      auVar29 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3fc90fdb),0x20);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3fc90fdb),0x30);
      uStack_3610 = auVar29._0_8_;
      uStack_3608 = auVar29._8_8_;
      auVar14._16_8_ = uStack_36d0;
      auVar14._0_16_ = auVar25;
      auVar14._24_8_ = uStack_36c8;
      auVar14 = vcmpps_avx(auVar78,auVar14,4);
      auVar4._16_8_ = uStack_36d0;
      auVar4._0_16_ = auVar25;
      auVar4._24_8_ = uStack_36c8;
      auVar10 = vcmpps_avx(auVar74,auVar4,4);
      auVar14 = vandps_avx(auVar14,auVar10);
      auVar52._16_8_ = uStack_3690;
      auVar52._0_16_ = auVar26;
      auVar52._24_8_ = uStack_3688;
      auVar4 = vandps_avx(auVar52,auVar79);
      auVar51._16_8_ = uStack_3690;
      auVar51._0_16_ = auVar26;
      auVar51._24_8_ = uStack_3688;
      auVar5 = vandps_avx(auVar51,auVar75);
      auVar15._16_8_ = uStack_36d0;
      auVar15._0_16_ = auVar25;
      auVar15._24_8_ = uStack_36c8;
      auVar8 = vcmpps_avx(auVar80,auVar15,1);
      auVar15 = vcmpps_avx(auVar76,auVar15,1);
      auVar50._16_8_ = uStack_3690;
      auVar50._0_16_ = auVar26;
      auVar50._24_8_ = uStack_3688;
      auVar15 = vandps_avx(auVar15,auVar50);
      auVar55._16_8_ = uStack_3650;
      auVar55._0_16_ = auVar27;
      auVar55._24_8_ = uStack_3648;
      auVar15 = vorps_avx(auVar15,auVar55);
      auVar15 = vandps_avx(auVar8,auVar15);
      auVar2 = vdivps_avx(auVar77,auVar81);
      auVar26 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0x80000000),0x20);
      auVar26 = vinsertps_avx(auVar26,ZEXT416(0x80000000),0x30);
      auVar29 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x80000000),0x20);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x80000000),0x30);
      uStack_2e10 = auVar29._0_8_;
      uStack_2e08 = auVar29._8_8_;
      auVar29 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3f800000),0x20);
      auVar29 = vinsertps_avx(auVar29,ZEXT416(0x3f800000),0x30);
      auVar30 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0x3f800000),0x20);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0x3f800000),0x30);
      uStack_2dd0 = auVar30._0_8_;
      uStack_2dc8 = auVar30._8_8_;
      auVar30 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0xbf800000),0x20);
      auVar30 = vinsertps_avx(auVar30,ZEXT416(0xbf800000),0x30);
      auVar31 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbf800000),0x20);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0xbf800000),0x30);
      uStack_2d90 = auVar31._0_8_;
      uStack_2d88 = auVar31._8_8_;
      auVar31 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0x3fc90fdb),0x20);
      auVar31 = vinsertps_avx(auVar31,ZEXT416(0x3fc90fdb),0x30);
      auVar32 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3fc90fdb),0x20);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3fc90fdb),0x30);
      uStack_2d50 = auVar32._0_8_;
      uStack_2d48 = auVar32._8_8_;
      auVar32 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3f800000),0x20);
      auVar32 = vinsertps_avx(auVar32,ZEXT416(0x3f800000),0x30);
      auVar33 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3f800000),0x20);
      auVar33 = vinsertps_avx(auVar33,ZEXT416(0x3f800000),0x30);
      uStack_2d10 = auVar33._0_8_;
      uStack_2d08 = auVar33._8_8_;
      auVar33 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar33 = vinsertps_avx(auVar33,ZEXT416(0xbeaaaa53),0x20);
      auVar33 = vinsertps_avx(auVar33,ZEXT416(0xbeaaaa53),0x30);
      auVar34 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
      auVar34 = vinsertps_avx(auVar34,ZEXT416(0xbeaaaa53),0x20);
      auVar34 = vinsertps_avx(auVar34,ZEXT416(0xbeaaaa53),0x30);
      uStack_2cd0 = auVar34._0_8_;
      uStack_2cc8 = auVar34._8_8_;
      auVar34 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar34 = vinsertps_avx(auVar34,ZEXT416(0x3e4cb974),0x20);
      auVar34 = vinsertps_avx(auVar34,ZEXT416(0x3e4cb974),0x30);
      auVar35 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
      auVar35 = vinsertps_avx(auVar35,ZEXT416(0x3e4cb974),0x20);
      auVar35 = vinsertps_avx(auVar35,ZEXT416(0x3e4cb974),0x30);
      uStack_2c90 = auVar35._0_8_;
      uStack_2c88 = auVar35._8_8_;
      auVar35 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar35 = vinsertps_avx(auVar35,ZEXT416(0xbe117200),0x20);
      auVar35 = vinsertps_avx(auVar35,ZEXT416(0xbe117200),0x30);
      auVar36 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
      auVar36 = vinsertps_avx(auVar36,ZEXT416(0xbe117200),0x20);
      auVar36 = vinsertps_avx(auVar36,ZEXT416(0xbe117200),0x30);
      uStack_2c50 = auVar36._0_8_;
      uStack_2c48 = auVar36._8_8_;
      auVar36 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar36 = vinsertps_avx(auVar36,ZEXT416(0x3dd9ed24),0x20);
      auVar36 = vinsertps_avx(auVar36,ZEXT416(0x3dd9ed24),0x30);
      auVar37 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
      auVar37 = vinsertps_avx(auVar37,ZEXT416(0x3dd9ed24),0x20);
      auVar37 = vinsertps_avx(auVar37,ZEXT416(0x3dd9ed24),0x30);
      uStack_2c10 = auVar37._0_8_;
      uStack_2c08 = auVar37._8_8_;
      auVar37 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar37 = vinsertps_avx(auVar37,ZEXT416(0xbd99b01e),0x20);
      auVar37 = vinsertps_avx(auVar37,ZEXT416(0xbd99b01e),0x30);
      auVar38 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
      auVar38 = vinsertps_avx(auVar38,ZEXT416(0xbd99b01e),0x20);
      auVar38 = vinsertps_avx(auVar38,ZEXT416(0xbd99b01e),0x30);
      uStack_2bd0 = auVar38._0_8_;
      uStack_2bc8 = auVar38._8_8_;
      auVar38 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar38 = vinsertps_avx(auVar38,ZEXT416(0x3d2edd4e),0x20);
      auVar38 = vinsertps_avx(auVar38,ZEXT416(0x3d2edd4e),0x30);
      auVar39 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
      auVar39 = vinsertps_avx(auVar39,ZEXT416(0x3d2edd4e),0x20);
      auVar39 = vinsertps_avx(auVar39,ZEXT416(0x3d2edd4e),0x30);
      uStack_2b90 = auVar39._0_8_;
      uStack_2b88 = auVar39._8_8_;
      auVar39 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar39 = vinsertps_avx(auVar39,ZEXT416(0xbc83a25c),0x20);
      auVar39 = vinsertps_avx(auVar39,ZEXT416(0xbc83a25c),0x30);
      auVar40 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
      auVar40 = vinsertps_avx(auVar40,ZEXT416(0xbc83a25c),0x20);
      auVar40 = vinsertps_avx(auVar40,ZEXT416(0xbc83a25c),0x30);
      uStack_2b50 = auVar40._0_8_;
      uStack_2b48 = auVar40._8_8_;
      auVar40 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar40 = vinsertps_avx(auVar40,ZEXT416(0x3b3ac537),0x20);
      auVar40 = vinsertps_avx(auVar40,ZEXT416(0x3b3ac537),0x30);
      auVar41 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
      auVar41 = vinsertps_avx(auVar41,ZEXT416(0x3b3ac537),0x20);
      auVar41 = vinsertps_avx(auVar41,ZEXT416(0x3b3ac537),0x30);
      uStack_2b10 = auVar41._0_8_;
      uStack_2b08 = auVar41._8_8_;
      auVar59._16_8_ = uStack_2e10;
      auVar59._0_16_ = auVar26;
      auVar59._24_8_ = uStack_2e08;
      auVar8 = vandps_avx(auVar59,auVar2);
      auVar62._16_8_ = uStack_2e10;
      auVar62._0_16_ = auVar26;
      auVar62._24_8_ = uStack_2e08;
      auVar16 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
      auVar3 = vandnps_avx(auVar62,auVar2);
      auVar56._16_8_ = uStack_2dd0;
      auVar56._0_16_ = auVar29;
      auVar56._24_8_ = uStack_2dc8;
      auVar6 = vcmpps_avx(auVar56,auVar3,1);
      auVar58._16_8_ = uStack_2d90;
      auVar58._0_16_ = auVar30;
      auVar58._24_8_ = uStack_2d88;
      auVar2 = vandps_avx(auVar6,auVar58);
      auVar11 = vandnps_avx(auVar6,auVar3);
      auVar11 = vorps_avx(auVar2,auVar11);
      auVar2 = vandps_avx(auVar6,auVar3);
      auVar61._16_8_ = uStack_2dd0;
      auVar61._0_16_ = auVar29;
      auVar61._24_8_ = uStack_2dc8;
      auVar3 = vandnps_avx(auVar6,auVar61);
      auVar2 = vorps_avx(auVar2,auVar3);
      auVar2 = vdivps_avx(auVar11,auVar2);
      local_2a40 = auVar2._0_4_;
      fStack_2a3c = auVar2._4_4_;
      fStack_2a38 = auVar2._8_4_;
      fStack_2a34 = auVar2._12_4_;
      fStack_2a30 = auVar2._16_4_;
      fStack_2a2c = auVar2._20_4_;
      fStack_2a28 = auVar2._24_4_;
      fStack_2a24 = auVar2._28_4_;
      fVar135 = local_2a40 * local_2a40;
      fVar139 = fStack_2a3c * fStack_2a3c;
      fVar141 = fStack_2a38 * fStack_2a38;
      fVar143 = fStack_2a34 * fStack_2a34;
      fVar145 = fStack_2a30 * fStack_2a30;
      fVar147 = fStack_2a2c * fStack_2a2c;
      fVar149 = fStack_2a28 * fStack_2a28;
      fVar136 = fVar135 * fVar135;
      fVar140 = fVar139 * fVar139;
      fVar142 = fVar141 * fVar141;
      fVar144 = fVar143 * fVar143;
      fVar146 = fVar145 * fVar145;
      fVar148 = fVar147 * fVar147;
      fVar150 = fVar149 * fVar149;
      auVar85._4_4_ = fVar140;
      auVar85._0_4_ = fVar136;
      auVar85._8_4_ = fVar142;
      auVar85._12_4_ = fVar144;
      auVar85._16_4_ = fVar146;
      auVar85._20_4_ = fVar148;
      auVar85._24_4_ = fVar150;
      auVar85._28_4_ = fStack_2a24;
      auVar94._16_8_ = uStack_2b50;
      auVar94._0_16_ = auVar39;
      auVar94._24_8_ = uStack_2b48;
      auVar96._16_8_ = uStack_2bd0;
      auVar96._0_16_ = auVar37;
      auVar96._24_8_ = uStack_2bc8;
      auVar26 = vfmadd213ps_fma(auVar94,auVar85,auVar96);
      auVar86._4_4_ = fVar140;
      auVar86._0_4_ = fVar136;
      auVar86._8_4_ = fVar142;
      auVar86._12_4_ = fVar144;
      auVar86._16_4_ = fVar146;
      auVar86._20_4_ = fVar148;
      auVar86._24_4_ = fVar150;
      auVar86._28_4_ = fStack_2a24;
      auVar98._16_8_ = uStack_2c50;
      auVar98._0_16_ = auVar35;
      auVar98._24_8_ = uStack_2c48;
      auVar26 = vfmadd213ps_fma(ZEXT1632(auVar26),auVar86,auVar98);
      auVar87._4_4_ = fVar140;
      auVar87._0_4_ = fVar136;
      auVar87._8_4_ = fVar142;
      auVar87._12_4_ = fVar144;
      auVar87._16_4_ = fVar146;
      auVar87._20_4_ = fVar148;
      auVar87._24_4_ = fVar150;
      auVar87._28_4_ = fStack_2a24;
      auVar100._16_8_ = uStack_2cd0;
      auVar100._0_16_ = auVar33;
      auVar100._24_8_ = uStack_2cc8;
      auVar26 = vfmadd213ps_fma(ZEXT1632(auVar26),auVar87,auVar100);
      auVar88._4_4_ = fVar140;
      auVar88._0_4_ = fVar136;
      auVar88._8_4_ = fVar142;
      auVar88._12_4_ = fVar144;
      auVar88._16_4_ = fVar146;
      auVar88._20_4_ = fVar148;
      auVar88._24_4_ = fVar150;
      auVar88._28_4_ = fStack_2a24;
      auVar93._16_8_ = uStack_2b10;
      auVar93._0_16_ = auVar40;
      auVar93._24_8_ = uStack_2b08;
      auVar95._16_8_ = uStack_2b90;
      auVar95._0_16_ = auVar38;
      auVar95._24_8_ = uStack_2b88;
      auVar29 = vfmadd213ps_fma(auVar93,auVar88,auVar95);
      auVar89._4_4_ = fVar140;
      auVar89._0_4_ = fVar136;
      auVar89._8_4_ = fVar142;
      auVar89._12_4_ = fVar144;
      auVar89._16_4_ = fVar146;
      auVar89._20_4_ = fVar148;
      auVar89._24_4_ = fVar150;
      auVar89._28_4_ = fStack_2a24;
      auVar97._16_8_ = uStack_2c10;
      auVar97._0_16_ = auVar36;
      auVar97._24_8_ = uStack_2c08;
      auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar89,auVar97);
      auVar90._4_4_ = fVar140;
      auVar90._0_4_ = fVar136;
      auVar90._8_4_ = fVar142;
      auVar90._12_4_ = fVar144;
      auVar90._16_4_ = fVar146;
      auVar90._20_4_ = fVar148;
      auVar90._24_4_ = fVar150;
      auVar90._28_4_ = fStack_2a24;
      auVar99._16_8_ = uStack_2c90;
      auVar99._0_16_ = auVar34;
      auVar99._24_8_ = uStack_2c88;
      auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar90,auVar99);
      auVar91._4_4_ = fVar140;
      auVar91._0_4_ = fVar136;
      auVar91._8_4_ = fVar142;
      auVar91._12_4_ = fVar144;
      auVar91._16_4_ = fVar146;
      auVar91._20_4_ = fVar148;
      auVar91._24_4_ = fVar150;
      auVar91._28_4_ = fStack_2a24;
      auVar101._16_8_ = uStack_2d10;
      auVar101._0_16_ = auVar32;
      auVar101._24_8_ = uStack_2d08;
      auVar29 = vfmadd213ps_fma(ZEXT1632(auVar29),auVar91,auVar101);
      auVar92._4_4_ = fVar139;
      auVar92._0_4_ = fVar135;
      auVar92._8_4_ = fVar141;
      auVar92._12_4_ = fVar143;
      auVar92._16_4_ = fVar145;
      auVar92._20_4_ = fVar147;
      auVar92._24_4_ = fVar149;
      auVar92._28_4_ = fStack_2a24;
      auVar26 = vfmadd213ps_fma(ZEXT1632(auVar26),auVar92,ZEXT1632(auVar29));
      local_2ac0 = auVar26._0_4_;
      fStack_2abc = auVar26._4_4_;
      fStack_2ab8 = auVar26._8_4_;
      fStack_2ab4 = auVar26._12_4_;
      auVar57._16_8_ = uStack_2d50;
      auVar57._0_16_ = auVar31;
      auVar57._24_8_ = uStack_2d48;
      auVar2 = vandps_avx(auVar6,auVar57);
      local_2ea0 = auVar2._0_4_;
      fStack_2e9c = auVar2._4_4_;
      fStack_2e98 = auVar2._8_4_;
      fStack_2e94 = auVar2._12_4_;
      fStack_2e90 = auVar2._16_4_;
      fStack_2e8c = auVar2._20_4_;
      fStack_2e88 = auVar2._24_4_;
      fStack_2e84 = auVar2._28_4_;
      auVar60._4_4_ = fStack_2abc * fStack_2a3c + fStack_2e9c;
      auVar60._0_4_ = local_2ac0 * local_2a40 + local_2ea0;
      auVar60._8_4_ = fStack_2ab8 * fStack_2a38 + fStack_2e98;
      auVar60._12_4_ = fStack_2ab4 * fStack_2a34 + fStack_2e94;
      auVar60._16_4_ = fStack_2a30 * 0.0 + fStack_2e90;
      auVar60._20_4_ = fStack_2a2c * 0.0 + fStack_2e8c;
      auVar60._24_4_ = fStack_2a28 * 0.0 + fStack_2e88;
      auVar60._28_4_ = fStack_2a24 + fStack_2e84;
      auVar8 = vorps_avx(auVar60,auVar8);
      local_3720 = auVar8._0_4_;
      fStack_371c = auVar8._4_4_;
      fStack_3718 = auVar8._8_4_;
      fStack_3714 = auVar8._12_4_;
      fStack_3710 = auVar8._16_4_;
      fStack_370c = auVar8._20_4_;
      fStack_3708 = auVar8._24_4_;
      fStack_3704 = auVar8._28_4_;
      local_3740 = auVar15._0_4_;
      fStack_373c = auVar15._4_4_;
      fStack_3738 = auVar15._8_4_;
      fStack_3734 = auVar15._12_4_;
      fStack_3730 = auVar15._16_4_;
      fStack_372c = auVar15._20_4_;
      fStack_3728 = auVar15._24_4_;
      fStack_3724 = auVar15._28_4_;
      auVar54._16_8_ = uStack_3650;
      auVar54._0_16_ = auVar27;
      auVar54._24_8_ = uStack_3648;
      auVar4 = vorps_avx(auVar4,auVar54);
      auVar48._16_8_ = uStack_36d0;
      auVar48._0_16_ = auVar25;
      auVar48._24_8_ = uStack_36c8;
      auVar15 = vcmpps_avx(auVar4,auVar48,1);
      auVar53._16_8_ = uStack_3610;
      auVar53._0_16_ = auVar28;
      auVar53._24_8_ = uStack_3608;
      auVar4 = vorps_avx(auVar5,auVar53);
      auVar4 = vandps_avx(auVar10,auVar4);
      auVar5._16_8_ = uStack_3650;
      auVar5._0_16_ = auVar27;
      auVar5._24_8_ = uStack_3648;
      auVar5 = vandps_avx(auVar15,auVar5);
      auVar63._16_8_ = uStack_36d0;
      auVar63._0_16_ = auVar25;
      auVar63._24_8_ = uStack_36c8;
      auVar15 = vandnps_avx(auVar15,auVar63);
      auVar5 = vorps_avx(auVar5,auVar15);
      auVar5 = vandnps_avx(auVar10,auVar5);
      auVar5 = vorps_avx(auVar4,auVar5);
      auVar49._4_4_ = fStack_371c + fStack_373c;
      auVar49._0_4_ = local_3720 + local_3740;
      auVar49._12_4_ = fStack_3714 + fStack_3734;
      auVar49._8_4_ = fStack_3718 + fStack_3738;
      auVar49._20_4_ = fStack_370c + fStack_372c;
      auVar49._16_4_ = fStack_3710 + fStack_3730;
      auVar49._28_4_ = fStack_3704 + fStack_3724;
      auVar49._24_4_ = fStack_3708 + fStack_3728;
      auVar4 = vandps_avx(auVar14,auVar49);
      local_2380 = auVar14._0_4_;
      uStack_237c = auVar14._4_4_;
      uStack_2378 = auVar14._8_4_;
      uStack_2374 = auVar14._12_4_;
      uStack_2370 = auVar14._16_4_;
      uStack_236c = auVar14._20_4_;
      uStack_2368 = auVar14._24_4_;
      uStack_2364 = auVar14._28_4_;
      auVar138._0_4_ = local_2380 ^ auVar16._0_4_;
      auVar138._4_4_ = uStack_237c ^ auVar16._4_4_;
      auVar138._8_4_ = uStack_2378 ^ auVar16._8_4_;
      auVar138._12_4_ = uStack_2374 ^ auVar16._12_4_;
      auVar138._16_4_ = uStack_2370 ^ auVar16._16_4_;
      auVar138._20_4_ = uStack_236c ^ auVar16._20_4_;
      auVar138._24_4_ = uStack_2368 ^ auVar16._24_4_;
      auVar138._28_4_ = uStack_2364 ^ auVar16._28_4_;
      auVar14 = vandps_avx(auVar138,auVar5);
      auVar14 = vorps_avx(auVar4,auVar14);
      local_3be0 = auVar14._0_8_;
      uStack_3bd8 = auVar14._8_8_;
      uStack_3bd0 = auVar14._16_8_;
      uStack_3bc8 = auVar14._24_8_;
      *local_3ac0 = local_3be0;
      local_3ac0[1] = uStack_3bd8;
      local_3ac0[2] = uStack_3bd0;
      local_3ac0[3] = uStack_3bc8;
      local_3ab8 = local_3ab8 + 2;
      local_3ac0 = local_3ac0 + 4;
    }
    for (; local_3b44 < in_ECX; local_3b44 = local_3b44 + 1) {
      uVar1 = *local_3ab8;
      uVar42 = CONCAT44(uVar1,uVar1);
      uVar43 = CONCAT44(uVar1,uVar1);
      auVar40._8_8_ = uVar43;
      auVar40._0_8_ = uVar42;
      auVar39._8_8_ = uVar43;
      auVar39._0_8_ = uVar42;
      auVar38._8_8_ = uVar43;
      auVar38._0_8_ = uVar42;
      auVar18._8_8_ = uVar43;
      auVar18._0_8_ = uVar42;
      auVar17 = vcmpps_avx(auVar21,ZEXT816(0),4);
      auVar18 = vcmpps_avx(auVar18,ZEXT816(0),4);
      auVar20 = vpand_avx(auVar17,auVar18);
      auVar26._8_8_ = 0x8000000080000000;
      auVar26._0_8_ = 0x8000000080000000;
      auVar25 = vpand_avx(auVar26,auVar22);
      auVar19._8_8_ = 0x8000000080000000;
      auVar19._0_8_ = 0x8000000080000000;
      auVar26 = vpand_avx(auVar19,auVar38);
      auVar17 = vcmpps_avx(auVar23,ZEXT816(0),1);
      auVar19 = vcmpps_avx(auVar39,ZEXT816(0),1);
      auVar27._8_8_ = 0x8000000080000000;
      auVar27._0_8_ = 0x8000000080000000;
      auVar19 = vpand_avx(auVar19,auVar27);
      auVar30._8_8_ = 0x40490fdb40490fdb;
      auVar30._0_8_ = 0x40490fdb40490fdb;
      auVar19 = vpor_avx(auVar19,auVar30);
      auVar27 = vpand_avx(auVar17,auVar19);
      auVar17 = vdivps_avx(auVar40,auVar24);
      auVar31._8_8_ = 0x8000000080000000;
      auVar31._0_8_ = 0x8000000080000000;
      auVar28 = vpand_avx(auVar31,auVar17);
      auVar37._8_8_ = 0x8000000080000000;
      auVar37._0_8_ = 0x8000000080000000;
      auVar31 = vpcmpeqd_avx(auVar30,auVar30);
      auVar29 = vpandn_avx(auVar37,auVar17);
      auVar35._8_8_ = 0x3f8000003f800000;
      auVar35._0_8_ = 0x3f8000003f800000;
      auVar17 = vcmpps_avx(auVar35,auVar29,1);
      auVar33._8_8_ = 0xbf800000bf800000;
      auVar33._0_8_ = 0xbf800000bf800000;
      auVar19 = vpand_avx(auVar17,auVar33);
      auVar30 = vpandn_avx(auVar17,auVar29);
      auVar30 = vpor_avx(auVar19,auVar30);
      auVar19 = vpand_avx(auVar17,auVar29);
      auVar36._8_8_ = 0x3f8000003f800000;
      auVar36._0_8_ = 0x3f8000003f800000;
      auVar29 = vpandn_avx(auVar17,auVar36);
      auVar19 = vpor_avx(auVar19,auVar29);
      auVar19 = vdivps_avx(auVar30,auVar19);
      local_610 = auVar19._0_4_;
      fStack_60c = auVar19._4_4_;
      fStack_608 = auVar19._8_4_;
      fStack_604 = auVar19._12_4_;
      fVar135 = local_610 * local_610;
      fVar139 = fStack_60c * fStack_60c;
      fVar141 = fStack_608 * fStack_608;
      fVar143 = fStack_604 * fStack_604;
      fVar136 = fVar135 * fVar135;
      fVar140 = fVar139 * fVar139;
      fVar142 = fVar141 * fVar141;
      fVar144 = fVar143 * fVar143;
      auVar41._4_4_ = fVar140;
      auVar41._0_4_ = fVar136;
      auVar41._8_4_ = fVar142;
      auVar41._12_4_ = fVar144;
      auVar127._8_8_ = 0xbc83a25cbc83a25c;
      auVar127._0_8_ = 0xbc83a25cbc83a25c;
      auVar129._8_8_ = 0xbd99b01ebd99b01e;
      auVar129._0_8_ = 0xbd99b01ebd99b01e;
      auVar19 = vfmadd213ps_fma(auVar127,auVar41,auVar129);
      auVar119._4_4_ = fVar140;
      auVar119._0_4_ = fVar136;
      auVar119._8_4_ = fVar142;
      auVar119._12_4_ = fVar144;
      auVar131._8_8_ = 0xbe117200be117200;
      auVar131._0_8_ = 0xbe117200be117200;
      auVar19 = vfmadd213ps_fma(auVar19,auVar119,auVar131);
      auVar120._4_4_ = fVar140;
      auVar120._0_4_ = fVar136;
      auVar120._8_4_ = fVar142;
      auVar120._12_4_ = fVar144;
      auVar133._8_8_ = 0xbeaaaa53beaaaa53;
      auVar133._0_8_ = 0xbeaaaa53beaaaa53;
      auVar19 = vfmadd213ps_fma(auVar19,auVar120,auVar133);
      auVar121._4_4_ = fVar140;
      auVar121._0_4_ = fVar136;
      auVar121._8_4_ = fVar142;
      auVar121._12_4_ = fVar144;
      auVar126._8_8_ = 0x3b3ac5373b3ac537;
      auVar126._0_8_ = 0x3b3ac5373b3ac537;
      auVar128._8_8_ = 0x3d2edd4e3d2edd4e;
      auVar128._0_8_ = 0x3d2edd4e3d2edd4e;
      auVar29 = vfmadd213ps_fma(auVar126,auVar121,auVar128);
      auVar122._4_4_ = fVar140;
      auVar122._0_4_ = fVar136;
      auVar122._8_4_ = fVar142;
      auVar122._12_4_ = fVar144;
      auVar130._8_8_ = 0x3dd9ed243dd9ed24;
      auVar130._0_8_ = 0x3dd9ed243dd9ed24;
      auVar29 = vfmadd213ps_fma(auVar29,auVar122,auVar130);
      auVar123._4_4_ = fVar140;
      auVar123._0_4_ = fVar136;
      auVar123._8_4_ = fVar142;
      auVar123._12_4_ = fVar144;
      auVar132._8_8_ = 0x3e4cb9743e4cb974;
      auVar132._0_8_ = 0x3e4cb9743e4cb974;
      auVar29 = vfmadd213ps_fma(auVar29,auVar123,auVar132);
      auVar124._4_4_ = fVar140;
      auVar124._0_4_ = fVar136;
      auVar124._8_4_ = fVar142;
      auVar124._12_4_ = fVar144;
      auVar134._8_8_ = 0x3f8000003f800000;
      auVar134._0_8_ = 0x3f8000003f800000;
      auVar29 = vfmadd213ps_fma(auVar29,auVar124,auVar134);
      auVar125._4_4_ = fVar139;
      auVar125._0_4_ = fVar135;
      auVar125._8_4_ = fVar141;
      auVar125._12_4_ = fVar143;
      auVar19 = vfmadd213ps_fma(auVar19,auVar125,auVar29);
      local_650 = auVar19._0_4_;
      fStack_64c = auVar19._4_4_;
      fStack_648 = auVar19._8_4_;
      fStack_644 = auVar19._12_4_;
      auVar32._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar32._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar17 = vpand_avx(auVar17,auVar32);
      local_680 = auVar17._0_4_;
      fStack_67c = auVar17._4_4_;
      fStack_678 = auVar17._8_4_;
      fStack_674 = auVar17._12_4_;
      auVar34._4_4_ = fStack_64c * fStack_60c + fStack_67c;
      auVar34._0_4_ = local_650 * local_610 + local_680;
      auVar34._8_4_ = fStack_648 * fStack_608 + fStack_678;
      auVar34._12_4_ = fStack_644 * fStack_604 + fStack_674;
      auVar17 = vpor_avx(auVar34,auVar28);
      local_b60 = auVar17._0_4_;
      fStack_b5c = auVar17._4_4_;
      fStack_b58 = auVar17._8_4_;
      fStack_b54 = auVar17._12_4_;
      local_b70 = auVar27._0_4_;
      fStack_b6c = auVar27._4_4_;
      fStack_b68 = auVar27._8_4_;
      fStack_b64 = auVar27._12_4_;
      auVar29._8_8_ = 0x40490fdb40490fdb;
      auVar29._0_8_ = 0x40490fdb40490fdb;
      auVar17 = vpor_avx(auVar25,auVar29);
      auVar17 = vcmpps_avx(auVar17,ZEXT816(0),1);
      auVar28._8_8_ = 0x3fc90fdb3fc90fdb;
      auVar28._0_8_ = 0x3fc90fdb3fc90fdb;
      auVar19 = vpor_avx(auVar26,auVar28);
      auVar19 = vpand_avx(auVar18,auVar19);
      auVar25._8_8_ = 0x40490fdb40490fdb;
      auVar25._0_8_ = 0x40490fdb40490fdb;
      auVar25 = vpand_avx(auVar17,auVar25);
      auVar17 = vpandn_avx(auVar17,ZEXT816(0));
      auVar17 = vpor_avx(auVar25,auVar17);
      auVar17 = vpandn_avx(auVar18,auVar17);
      auVar18 = vpor_avx(auVar19,auVar17);
      auVar17._4_4_ = fStack_b5c + fStack_b6c;
      auVar17._0_4_ = local_b60 + local_b70;
      auVar17._12_4_ = fStack_b54 + fStack_b64;
      auVar17._8_4_ = fStack_b58 + fStack_b68;
      auVar17 = vpand_avx(auVar20,auVar17);
      auVar18 = vpand_avx(auVar20 ^ auVar31,auVar18);
      auVar17 = vpor_avx(auVar17,auVar18);
      local_3c00 = auVar17._0_8_;
      uStack_3bf8 = auVar17._8_8_;
      *local_3ac0 = local_3c00;
      local_3ac0[1] = uStack_3bf8;
      local_3ab8 = local_3ab8 + 1;
      local_3ac0 = local_3ac0 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb_a(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        __m512 _p = _mm512_loadu_ps(ptr);
        for (; i < w; i++)
        {
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
        __m256 _p = _mm256_loadu_ps(ptr);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p), _p, 1);
        for (; i + 1 < w; i += 2)
        {
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
        __m128 _p = _mm_loadu_ps(ptr);
#if __AVX__
        __m256 _p_256 = _mm256_insertf128_ps(_mm256_castps128_ps256(_p), _p, 1);
#if __AVX512F__
        __m512 _p_512 = _mm512_insertf32x8(_mm512_castps256_ps512(_p_256), _p_256, 1);
        for (; i + 3 < w; i += 4)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p_512, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p_256, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}